

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O2

LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> * __thiscall
data_structures::LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
insertAfterNode(LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this,
               ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *_current,
               SPElement *new_element)

{
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar1;
  
  pLVar1 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
           operator_new(0x18);
  pLVar1->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010bc98;
  pLVar1->element = *new_element;
  pLVar1->_next = _current->_next;
  _current->_next = pLVar1;
  this->_size = this->_size + 1;
  if (this->_tail == _current) {
    this->_tail = pLVar1;
  }
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::insertAfterNode(ListNode<T>* _current, const T &new_element){
        _current->insertAfter(new ListNode<T>(new_element));
        _size++;
        if (_current == _tail) {
            _tail = _current->next();
        }
        return this;
    }